

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall
wallet::anon_unknown_48::FastWalletRescanFilter::UpdateIfNeeded(FastWalletRescanFilter *this)

{
  bool bVar1;
  int32_t iVar2;
  iterator this_00;
  iterator desc_spkm_00;
  type_conflict2 *ptVar3;
  uint256 *puVar4;
  mapped_type_conflict3 *pmVar5;
  key_type *in_RDI;
  long in_FS_OFFSET;
  int32_t current_range_end;
  DescriptorScriptPubKeyMan *desc_spkm;
  type *last_range_end;
  type *desc_spkm_id;
  map<uint256,_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_int>_>_> *__range2;
  iterator __end2;
  iterator __begin2;
  DescriptorScriptPubKeyMan *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int32_t in_stack_ffffffffffffff74;
  uint256 *in_stack_ffffffffffffff78;
  CWallet *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  key_type *pkVar6;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pkVar6 = in_RDI;
  this_00 = std::
            map<uint256,_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_int>_>_>::
            begin((map<uint256,_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_int>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  desc_spkm_00 = std::
                 map<uint256,_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_int>_>_>
                 ::end((map<uint256,_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_int>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  while( true ) {
    bVar1 = std::operator==((_Self *)in_stack_ffffffffffffff78,
                            (_Self *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
      __stack_chk_fail();
    }
    std::_Rb_tree_iterator<std::pair<const_uint256,_int>_>::operator*
              ((_Rb_tree_iterator<std::pair<const_uint256,_int>_> *)in_stack_ffffffffffffff68);
    std::get<0ul,uint256_const,int>((pair<const_uint256,_int> *)in_stack_ffffffffffffff68);
    ptVar3 = std::get<1ul,uint256_const,int>((pair<const_uint256,_int> *)in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff80 =
         (CWallet *)CWallet::GetScriptPubKeyMan(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78)
    ;
    if (in_stack_ffffffffffffff80 == (CWallet *)0x0) {
      puVar4 = (uint256 *)0x0;
    }
    else {
      puVar4 = (uint256 *)
               __dynamic_cast(in_stack_ffffffffffffff80,&ScriptPubKeyMan::typeinfo,
                              &DescriptorScriptPubKeyMan::typeinfo,0);
    }
    if (puVar4 == (uint256 *)0x0) break;
    in_stack_ffffffffffffff78 = puVar4;
    iVar2 = DescriptorScriptPubKeyMan::GetEndRange(in_stack_ffffffffffffff68);
    if (*ptVar3 < iVar2) {
      in_stack_ffffffffffffff74 = iVar2;
      AddScriptPubKeys((FastWalletRescanFilter *)this_00._M_node,
                       (DescriptorScriptPubKeyMan *)desc_spkm_00._M_node,
                       (int32_t)((ulong)pkVar6 >> 0x20));
      in_stack_ffffffffffffff68 =
           (DescriptorScriptPubKeyMan *)((in_RDI->super_base_blob<256U>).m_data._M_elems + 8);
      iVar2 = in_stack_ffffffffffffff74;
      (*(code *)(*(_Base_ptr *)(puVar4->super_base_blob<256U>).m_data._M_elems)[6]._M_left)
                (local_28);
      pmVar5 = std::
               map<uint256,_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_int>_>_>
               ::at((map<uint256,_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_int>_>_>
                     *)CONCAT44(iVar2,in_stack_ffffffffffffff90),in_RDI);
      *pmVar5 = in_stack_ffffffffffffff74;
    }
    std::_Rb_tree_iterator<std::pair<const_uint256,_int>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_uint256,_int>_> *)in_stack_ffffffffffffff68);
  }
  __assert_fail("desc_spkm != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                ,0x150,
                "void wallet::(anonymous namespace)::FastWalletRescanFilter::UpdateIfNeeded()");
}

Assistant:

void UpdateIfNeeded()
    {
        // repopulate filter with new scripts if top-up has happened since last iteration
        for (const auto& [desc_spkm_id, last_range_end] : m_last_range_ends) {
            auto desc_spkm{dynamic_cast<DescriptorScriptPubKeyMan*>(m_wallet.GetScriptPubKeyMan(desc_spkm_id))};
            assert(desc_spkm != nullptr);
            int32_t current_range_end{desc_spkm->GetEndRange()};
            if (current_range_end > last_range_end) {
                AddScriptPubKeys(desc_spkm, last_range_end);
                m_last_range_ends.at(desc_spkm->GetID()) = current_range_end;
            }
        }
    }